

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O1

Error asmjit::v1_14::arm::FormatterInternal::formatRegister
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rId,uint32_t elementType,uint32_t elementIndex)

{
  uint32_t rId_00;
  byte bVar1;
  Error EVar2;
  Error EVar3;
  uint uVar4;
  VirtReg *pVVar5;
  ulong uVar6;
  Arch arch_00;
  char *str;
  BaseEmitter *emitter_00;
  uint uVar7;
  char cVar8;
  uint uVar9;
  FormatFlags FVar10;
  RegType regType_00;
  uint32_t rId_01;
  Error EVar11;
  bool bVar12;
  bool bVar13;
  size_t size;
  
  uVar6 = (ulong)rId;
  EVar11 = rId - 0x100;
  arch_00 = emitter == (BaseEmitter *)0x0 || 0xfffffefe < EVar11;
  if (((bool)arch_00) || (emitter->_emitterType != kCompiler)) {
    bVar12 = false;
  }
  else {
    if (EVar11 < *(uint *)&emitter[3]._errorHandler) {
      regType_00 = regType;
      pVVar5 = BaseCompiler::virtRegById((BaseCompiler *)emitter,rId);
      if (pVVar5 == (VirtReg *)0x0) {
        formatRegister();
        uVar6 = uVar6 & 0xffffffff;
        EVar11 = String::_opChar((String *)emitter,kAppend,'{');
        if (EVar11 == 0) {
          bVar12 = true;
          do {
            FVar10 = kMachineCode;
            uVar4 = (uint)uVar6;
            if (uVar4 == 0) {
              EVar11 = String::_opChar((String *)emitter,kAppend,'}');
              return EVar11;
            }
            rId_00 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> rId_00 & 1) == 0; rId_00 = rId_00 + 1) {
              }
            }
            uVar4 = 1 << ((byte)rId_00 & 0x1f);
            rId_01 = rId_00 - 1;
            uVar9 = 0;
            do {
              uVar7 = (uint)uVar6 & ~uVar4;
              uVar6 = (ulong)uVar7;
              uVar4 = uVar4 * 2;
              uVar9 = uVar9 + 1;
              rId_01 = rId_01 + 1;
            } while ((uVar7 & uVar4) != 0);
            if (((bVar12) ||
                (EVar2 = String::_opString((String *)emitter,kAppend,", ",0xffffffffffffffff),
                EVar2 == 0)) &&
               (EVar2 = formatRegister((String *)emitter,FVar10,emitter_00,arch_00,regType_00,rId_00
                                       ,0,0xffffffff), EVar2 == 0)) {
              FVar10 = kMachineCode;
              if (uVar9 < 2) {
                bVar13 = true;
                bVar12 = false;
                EVar2 = EVar11;
              }
              else {
                EVar2 = String::_opChar((String *)emitter,kAppend,'-');
                if (EVar2 != 0) goto LAB_0012d90b;
                EVar2 = formatRegister((String *)emitter,FVar10,emitter_00,arch_00,regType_00,rId_01
                                       ,0,0xffffffff);
                bVar13 = EVar2 == 0;
                if (bVar13) {
                  bVar12 = false;
                  EVar2 = EVar11;
                }
              }
            }
            else {
LAB_0012d90b:
              bVar13 = false;
            }
            EVar11 = EVar2;
          } while (bVar13);
        }
        return EVar11;
      }
      if (*(uint *)(pVVar5 + 0x18) < 0xc) {
        pVVar5 = pVVar5 + 0x1c;
      }
      else {
        pVVar5 = *(VirtReg **)(pVVar5 + 0x20);
      }
      if ((pVVar5 == (VirtReg *)0x0) || (*pVVar5 == (VirtReg)0x0)) {
        bVar13 = false;
        EVar11 = String::_opFormat(sb,kAppend,"%%%u",(ulong)EVar11);
        bVar12 = false;
        if (EVar11 == 0) goto LAB_0012d721;
      }
      else {
        EVar11 = String::_opString(sb,kAppend,(char *)pVVar5,0xffffffffffffffff);
        if (EVar11 == 0) {
LAB_0012d721:
          bVar13 = true;
          bVar12 = true;
        }
        else {
          bVar13 = false;
          bVar12 = false;
        }
      }
    }
    else {
      bVar13 = true;
      bVar12 = false;
    }
    if (!bVar13) {
      return EVar11;
    }
  }
  if (!bVar12) {
    uVar4 = (uint)regType;
    if (uVar4 - 8 < 5) {
      cVar8 = 'v';
      if (elementType == 0) {
        cVar8 = "bhsdq"[uVar4 - 8];
      }
LAB_0012d5f1:
      EVar2 = EVar11;
      if (cVar8 == '\0') {
        bVar12 = true;
      }
      else {
        EVar11 = String::_opFormat(sb,kAppend,"%c%u",(ulong)(uint)(int)cVar8,(ulong)rId);
        bVar12 = EVar11 == 0;
        if (!bVar12) {
          EVar2 = EVar11;
        }
      }
    }
    else {
      if (uVar4 != 6) {
        if ((uVar4 == 7) && ((arch & k32BitMask) == kUnknown)) {
          if (rId == 0x1f) {
            str = "sp";
            size = 2;
            goto LAB_0012d74e;
          }
          cVar8 = 'x';
          if (rId == 0x3f) {
            str = "xzr";
            goto LAB_0012d73b;
          }
        }
        else {
          bVar12 = false;
          cVar8 = '\0';
          EVar2 = String::_opFormat(sb,kAppend,"<Reg-%u>?%u",(ulong)regType,(ulong)rId);
          if (EVar2 != 0) goto LAB_0012d762;
        }
        goto LAB_0012d5f1;
      }
      cVar8 = 'r';
      if ((arch & k32BitMask) != kUnknown) goto LAB_0012d5f1;
      if (rId == 0x1f) {
        str = "wsp";
      }
      else {
        cVar8 = 'w';
        if (rId != 0x3f) goto LAB_0012d5f1;
        str = "wzr";
      }
LAB_0012d73b:
      size = 3;
LAB_0012d74e:
      EVar2 = String::_opString(sb,kAppend,str,size);
      bVar12 = false;
    }
LAB_0012d762:
    EVar11 = EVar2;
    if (!bVar12) {
      return EVar11;
    }
  }
  if (elementType == 0) goto LAB_0012d7f9;
  uVar6 = 7;
  if (elementType < 7) {
    uVar6 = (ulong)elementType;
  }
  cVar8 = formatElementDataTable[uVar6 * 4];
  bVar1 = (byte)formatElementDataTable[uVar6 * 4 + 1] >> (regType == kARM_VecD);
  EVar2 = String::_opChar(sb,kAppend,'.');
  if (EVar2 == 0) {
    if (bVar1 != 0) {
      bVar12 = false;
      EVar2 = String::_opNumber(sb,kAppend,(ulong)bVar1,0,0,kNone);
      if (EVar2 != 0) goto LAB_0012d7f4;
    }
    EVar3 = String::_opChar(sb,kAppend,cVar8);
    bVar12 = EVar3 == 0;
    EVar2 = EVar11;
    if (!bVar12) {
      EVar2 = EVar3;
    }
  }
  else {
    bVar12 = false;
  }
LAB_0012d7f4:
  if (!bVar12) {
    return EVar2;
  }
LAB_0012d7f9:
  if ((elementIndex == 0xffffffff) || (EVar11 = String::_opFormat(sb,kAppend,"[%u]"), EVar11 == 0))
  {
    EVar11 = 0;
  }
  return EVar11;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rId,
  uint32_t elementType,
  uint32_t elementIndex) noexcept {

  DebugUtils::unused(flags);
  DebugUtils::unused(arch);

  static const char bhsdq[] = "bhsdq";

  bool virtRegFormatted = false;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(rId)) {
    if (emitter && emitter->isCompiler()) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(rId)) {
        VirtReg* vReg = cc->virtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(rId))));

        virtRegFormatted = true;
      }
    }
  }
#else
  DebugUtils::unused(emitter, flags);
#endif

  if (!virtRegFormatted) {
    char letter = '\0';
    switch (regType) {
      case RegType::kARM_VecB:
      case RegType::kARM_VecH:
      case RegType::kARM_VecS:
      case RegType::kARM_VecD:
      case RegType::kARM_VecV:
        letter = bhsdq[uint32_t(regType) - uint32_t(RegType::kARM_VecB)];
        if (elementType)
          letter = 'v';
        break;

      case RegType::kARM_GpW:
        if (Environment::is64Bit(arch)) {
          letter = 'w';

          if (rId == a64::Gp::kIdZr)
            return sb.append("wzr", 3);

          if (rId == a64::Gp::kIdSp)
            return sb.append("wsp", 3);
        }
        else {
          letter = 'r';
        }
        break;

      case RegType::kARM_GpX:
        if (Environment::is64Bit(arch)) {
          if (rId == a64::Gp::kIdZr)
            return sb.append("xzr", 3);
          if (rId == a64::Gp::kIdSp)
            return sb.append("sp", 2);

          letter = 'x';
          break;
        }

        // X registers are undefined in 32-bit mode.
        ASMJIT_FALLTHROUGH;

      default:
        ASMJIT_PROPAGATE(sb.appendFormat("<Reg-%u>?%u", uint32_t(regType), rId));
        break;
    }

    if (letter)
      ASMJIT_PROPAGATE(sb.appendFormat("%c%u", letter, rId));
  }

  constexpr uint32_t kElementTypeCount = uint32_t(a64::VecElementType::kMaxValue) + 1;
  if (elementType) {
    elementType = Support::min(elementType, kElementTypeCount);

    FormatElementData elementData = formatElementDataTable[elementType];
    uint32_t elementCount = elementData.elementCount;

    if (regType == RegType::kARM_VecD) {
      elementCount /= 2u;
    }

    ASMJIT_PROPAGATE(sb.append('.'));
    if (elementCount) {
      ASMJIT_PROPAGATE(sb.appendUInt(elementCount));
    }
    ASMJIT_PROPAGATE(sb.append(elementData.letter));
  }

  if (elementIndex != 0xFFFFFFFFu) {
    ASMJIT_PROPAGATE(sb.appendFormat("[%u]", elementIndex));
  }

  return kErrorOk;
}